

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O3

int fillpara(int f,int n)

{
  char cVar1;
  int iVar2;
  int iVar3;
  line *plVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  line *plVar8;
  long lVar9;
  uint uVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  undefined8 uStack_160;
  byte local_158 [8];
  char wbuf [256];
  
  if (n == 0) {
    iVar6 = 1;
  }
  else {
    uStack_160 = 0x114b87;
    undo_boundary_enable(8,0);
    uStack_160 = 0x114b9d;
    do_gotoeop(8,1,(int *)local_158);
    if (curwp->w_doto == 0) {
      plVar8 = (line *)&curwp->w_dotp;
    }
    else {
      uStack_160 = 0x114bb3;
      lnewline();
      plVar8 = curwp->w_dotp;
    }
    plVar8 = plVar8->l_fp;
    uStack_160 = 0x114be2;
    gotobop(8,1);
    do {
      uStack_160 = 0x114be7;
      iVar6 = inword();
      if (iVar6 != 0) break;
      uStack_160 = 0x114bfa;
      iVar6 = forwchar(8,1);
    } while (iVar6 != 0);
    iVar13 = curwp->w_doto;
    bVar5 = true;
    uVar10 = 0;
    do {
      iVar2 = curwp->w_doto;
      plVar4 = curwp->w_dotp;
      iVar3 = plVar4->l_used;
      if (iVar2 == iVar3) {
        bVar15 = plVar4->l_fp == plVar8;
        bVar11 = 0x20;
      }
      else {
        bVar11 = plVar4->l_text[iVar2];
        bVar15 = false;
      }
      iVar6 = 0;
      uStack_160 = 0x114c58;
      iVar7 = ldelete(1,0);
      if (iVar7 == 0 && !bVar15) goto LAB_00114e6f;
      if ((bVar11 == 9) || (bVar11 == 0x20)) {
        if (uVar10 == 0) {
          uVar10 = 0;
        }
        else {
          uVar14 = (ulong)uVar10;
          if ((!bVar15) && (uVar14 = (ulong)uVar10, dblspace != 0)) {
            if (iVar2 != iVar3) {
              if (((curwp->w_doto != curwp->w_dotp->l_used) &&
                  (cVar1 = curwp->w_dotp->l_text[curwp->w_doto], cVar1 != ' ')) &&
                 (uVar14 = (ulong)uVar10, cVar1 != '\t')) goto LAB_00114d8e;
            }
            if ((cinfo[local_158[(long)(int)uVar10 + -1]] & 0x10U) == 0) {
              uVar14 = (ulong)uVar10;
              if ((1 < (int)uVar10 && local_158[(long)(int)uVar10 + -1] == 0x29) &&
                 (uVar14 = (ulong)uVar10,
                 ((byte)cinfo[local_158[uVar10 - 2]] >> 4 & uVar10 < 0xff) != 0)) {
LAB_00114d82:
                uVar14 = (ulong)(uVar10 + 1);
                local_158[(int)uVar10] = 0x20;
              }
            }
            else {
              uVar14 = (ulong)uVar10;
              if ((int)uVar10 < 0xff) goto LAB_00114d82;
            }
          }
LAB_00114d8e:
          if (fillcol < (int)(iVar13 + uVar10 + 1)) {
            if ((0 < curwp->w_doto) &&
               (uVar10 = curwp->w_doto - 1, curwp->w_dotp->l_text[uVar10] == ' ')) {
              curwp->w_doto = uVar10;
              uStack_160 = 0x114dd2;
              ldelete(1,0);
            }
            uStack_160 = 0x114dd7;
            lnewline();
            iVar13 = 0;
          }
          else {
            if (!bVar5) {
              iVar13 = iVar13 + 1;
              uStack_160 = 0x114e02;
              linsert(1,0x20);
            }
            bVar5 = false;
          }
          if ((int)uVar14 < 1) {
            uVar10 = 0;
          }
          else {
            uVar12 = 0;
            do {
              uStack_160 = 0x114e2c;
              linsert(1,(int)(char)local_158[uVar12]);
              uVar12 = uVar12 + 1;
            } while (uVar14 != uVar12);
            iVar13 = (int)uVar14 + iVar13;
            uVar10 = 0;
          }
        }
      }
      else if ((int)uVar10 < 0xff) {
        lVar9 = (long)(int)uVar10;
        uVar10 = uVar10 + 1;
        local_158[lVar9] = bVar11;
      }
      else {
        uStack_160 = 0x114d69;
        ewprintf("Word too long!");
      }
    } while (!bVar15);
    uStack_160 = 0x114e5a;
    lnewline();
    iVar6 = 1;
    uStack_160 = 0x114e6f;
    backchar(8,1);
LAB_00114e6f:
    uStack_160 = 0x114e7e;
    undo_boundary_enable(8,1);
  }
  return iVar6;
}

Assistant:

int
fillpara(int f, int n)
{
	int	 c;		/* current char during scan		*/
	int	 wordlen;	/* length of current word		*/
	int	 clength;	/* position on line during fill		*/
	int	 i;		/* index during word copy		*/
	int	 eopflag;	/* Are we at the End-Of-Paragraph?	*/
	int	 firstflag;	/* first word? (needs no space)		*/
	int	 newlength;	/* tentative new line length		*/
	int	 eolflag;	/* was at end of line			*/
	int	 retval;	/* return value				*/
	struct line	*eopline;	/* pointer to line just past EOP	*/
	char	 wbuf[MAXWORD];	/* buffer for current word		*/

	if (n == 0)
		return (TRUE);

	undo_boundary_enable(FFRAND, 0);

	/* record the pointer to the line just past the EOP */
	(void)gotoeop(FFRAND, 1);
	if (curwp->w_doto != 0) {
		/* paragraph ends at end of buffer */
		(void)lnewline();
		eopline = lforw(curwp->w_dotp);
	} else
		eopline = curwp->w_dotp;

	/* and back top the beginning of the paragraph */
	(void)gotobop(FFRAND, 1);

	/* initialize various info */
	while (inword() == 0 && forwchar(FFRAND, 1));

	clength = curwp->w_doto;
	wordlen = 0;

	/* scan through lines, filling words */
	firstflag = TRUE;
	eopflag = FALSE;
	while (!eopflag) {

		/* get the next character in the paragraph */
		if ((eolflag = (curwp->w_doto == llength(curwp->w_dotp)))) {
			c = ' ';
			if (lforw(curwp->w_dotp) == eopline)
				eopflag = TRUE;
		} else
			c = lgetc(curwp->w_dotp, curwp->w_doto);

		/* and then delete it */
		if (ldelete((RSIZE) 1, KNONE) == FALSE && !eopflag) {
			retval = FALSE;
			goto cleanup;
		}

		/* if not a separator, just add it in */
		if (c != ' ' && c != '\t') {
			if (wordlen < MAXWORD - 1)
				wbuf[wordlen++] = c;
			else {
				/*
				 * You lose chars beyond MAXWORD if the word
				 * is too long. I'm too lazy to fix it now; it
				 * just silently truncated the word before,
				 * so I get to feel smug.
				 */
				ewprintf("Word too long!");
			}
		} else if (wordlen) {

			/* calculate tentative new length with word added */
			newlength = clength + 1 + wordlen;

			/*
			 * if at end of line or at doublespace and previous
			 * character was one of '.','?','!' doublespace here.
			 * behave the same way if a ')' is preceded by a
			 * [.?!] and followed by a doublespace.
			 */
			if (dblspace && (!eopflag && ((eolflag ||
			    curwp->w_doto == llength(curwp->w_dotp) ||
			    (c = lgetc(curwp->w_dotp, curwp->w_doto)) == ' '
			    || c == '\t') && (ISEOSP(wbuf[wordlen - 1]) ||
			    (wbuf[wordlen - 1] == ')' && wordlen >= 2 &&
			    ISEOSP(wbuf[wordlen - 2])))) &&
			    wordlen < MAXWORD - 1))
				wbuf[wordlen++] = ' ';

			/* at a word break with a word waiting */
			if (newlength <= fillcol) {
				/* add word to current line */
				if (!firstflag) {
					(void)linsert(1, ' ');
					++clength;
				}
				firstflag = FALSE;
			} else {
				if (curwp->w_doto > 0 &&
				    lgetc(curwp->w_dotp, curwp->w_doto - 1) == ' ') {
					curwp->w_doto -= 1;
					(void)ldelete((RSIZE) 1, KNONE);
				}
				/* start a new line */
				(void)lnewline();
				clength = 0;
			}

			/* and add the word in in either case */
			for (i = 0; i < wordlen; i++) {
				(void)linsert(1, wbuf[i]);
				++clength;
			}
			wordlen = 0;
		}
	}
	/* and add a last newline for the end of our new paragraph */
	(void)lnewline();

	/*
	 * We really should wind up where we started, (which is hard to keep
	 * track of) but I think the end of the last line is better than the
	 * beginning of the blank line.
	 */
	(void)backchar(FFRAND, 1);
	retval = TRUE;
cleanup:
	undo_boundary_enable(FFRAND, 1);
	return (retval);
}